

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

int __thiscall
llvm::
DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
::init(DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
       *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint Num;
  DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
  *extraout_RAX;
  uint InitBuckets;
  uint InitNumEntries_local;
  DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
  *this_local;
  
  Num = DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
        ::getMinBucketToReserveForEntries
                  ((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                    *)this,(uint)ctx);
  bVar1 = allocateBuckets(this,Num);
  if (bVar1) {
    DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
    ::initEmpty((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                 *)this);
    this = extraout_RAX;
  }
  else {
    this->NumEntries = 0;
    this->NumTombstones = 0;
  }
  return (int)this;
}

Assistant:

void init(unsigned InitNumEntries) {
    auto InitBuckets = BaseT::getMinBucketToReserveForEntries(InitNumEntries);
    if (allocateBuckets(InitBuckets)) {
      this->BaseT::initEmpty();
    } else {
      NumEntries = 0;
      NumTombstones = 0;
    }
  }